

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float left,float right,float bottom,float top,
          float zNear,float zFar,bool directX)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix4f *m;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar7 [64];
  undefined1 in_register_000012c4 [12];
  
  auVar7._4_60_ = in_register_00001284;
  auVar7._0_4_ = bottom;
  auVar5._4_60_ = in_register_00001244;
  auVar5._0_4_ = right;
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = left;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  auVar2 = vinsertps_avx(auVar4._0_16_,auVar7._0_16_,0x10);
  auVar3._4_12_ = in_register_000012c4;
  auVar3._0_4_ = top;
  auVar3 = vinsertps_avx(auVar5._0_16_,auVar3,0x10);
  __return_storage_ptr__->m_elements[0] = 2.0 / (right - left);
  auVar6._0_4_ = auVar2._0_4_ + auVar3._0_4_;
  auVar6._4_4_ = auVar2._4_4_ + auVar3._4_4_;
  auVar6._8_4_ = auVar2._8_4_ + auVar3._8_4_;
  auVar6._12_4_ = auVar2._12_4_ + auVar3._12_4_;
  auVar2 = vsubps_avx(auVar2,auVar3);
  auVar2 = vdivps_avx(auVar6,auVar2);
  __return_storage_ptr__->m_elements[5] = 2.0 / (top - bottom);
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  uVar1 = vmovlps_avx(auVar2);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 0xc) = uVar1;
  __return_storage_ptr__->m_elements[10] =
       (float)((uint)directX * 0x3f800000 + (uint)!directX * 0x40000000) / (zNear - zFar);
  __return_storage_ptr__->m_elements[0xe] =
       (float)((uint)directX * (int)zNear + (uint)!directX * (int)(zNear + zFar)) / (zNear - zFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float left, float right, float bottom, float top, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / ( right - left );
	m( 1, 1 ) = 2.0f / ( top - bottom );
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = ( left + right ) / ( left - right );
	m( 1, 3 ) = ( top + bottom ) / ( bottom - top );

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}